

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw-out.c
# Opt level: O1

CURLcode cw_out_write(Curl_easy *data,Curl_cwriter *writer,int type,char *buf,size_t blen)

{
  cw_out_ctx *ctx;
  CURLcode CVar1;
  size_t in_R9;
  
  ctx = (cw_out_ctx *)writer->ctx;
  if ((((type & 1U) != 0) || (((type & 4U) != 0 && (((data->set).field_0x89f & 4) != 0)))) &&
     (CVar1 = cw_out_do_write(ctx,data,CW_OUT_BODY,SUB81(buf,0),(char *)blen,in_R9),
     CVar1 != CURLE_OK)) {
    return CVar1;
  }
  if (((type & 6U) != 0) &&
     (CVar1 = cw_out_do_write(ctx,data,CW_OUT_HDS,SUB81(buf,0),(char *)blen,in_R9),
     CVar1 != CURLE_OK)) {
    return CVar1;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode cw_out_write(struct Curl_easy *data,
                             struct Curl_cwriter *writer, int type,
                             const char *buf, size_t blen)
{
  struct cw_out_ctx *ctx = writer->ctx;
  CURLcode result;
  bool flush_all = !!(type & CLIENTWRITE_EOS);

  if((type & CLIENTWRITE_BODY) ||
     ((type & CLIENTWRITE_HEADER) && data->set.include_header)) {
    result = cw_out_do_write(ctx, data, CW_OUT_BODY, flush_all, buf, blen);
    if(result)
      return result;
  }

  if(type & (CLIENTWRITE_HEADER|CLIENTWRITE_INFO)) {
    result = cw_out_do_write(ctx, data, CW_OUT_HDS, flush_all, buf, blen);
    if(result)
      return result;
  }

  return CURLE_OK;
}